

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O1

bool __thiscall
TTD::ThreadContextTTD::ResolveIsLongLivedForExtract(ThreadContextTTD *this,TTD_LOG_PTR_ID origId)

{
  Type piVar1;
  Type pSVar2;
  undefined1 uVar3;
  uint uVar4;
  Type this_00;
  uint uVar5;
  
  piVar1 = (this->m_ttdMayBeLongLivedRoot).buckets;
  uVar4 = 0;
  if (piVar1 != (Type)0x0) {
    uVar4 = JsUtil::
            BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(((uint)(origId >> 0x20) ^ (uint)origId) * 2 + 1,
                        (this->m_ttdMayBeLongLivedRoot).bucketCount,
                        (this->m_ttdMayBeLongLivedRoot).modFunctionIndex);
    uVar5 = piVar1[uVar4];
    uVar4 = 0;
    if (-1 < (int)uVar5) {
      pSVar2 = (this->m_ttdMayBeLongLivedRoot).entries;
      uVar4 = 0;
      do {
        if (pSVar2[uVar5].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key == origId) {
          this_00 = (this->m_ttdMayBeLongLivedRoot).stats;
          goto LAB_009378a3;
        }
        uVar4 = uVar4 + 1;
        uVar5 = pSVar2[uVar5].
                super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_long,_bool>.
                super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
      } while (-1 < (int)uVar5);
    }
  }
  this_00 = (this->m_ttdMayBeLongLivedRoot).stats;
  uVar5 = 0xffffffff;
LAB_009378a3:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  if ((int)uVar5 < 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (this->m_ttdMayBeLongLivedRoot).entries[uVar5].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.value;
  }
  return (bool)uVar3;
}

Assistant:

bool ResolveIsLongLivedForExtract(TTD_LOG_PTR_ID origId) const { return this->m_ttdMayBeLongLivedRoot.LookupWithKey(origId, false); }